

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_status.hpp
# Opt level: O3

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,
                mrg_status<int,_5,_trng::mrg5s> *S)

{
  undefined4 uVar1;
  long lVar2;
  mrg_status<int,_5,_trng::mrg5s> S_new;
  delim_c local_3d;
  int local_3c [5];
  
  local_3c[0] = 0;
  local_3c[1] = 1;
  local_3c[2] = 1;
  local_3c[3] = 1;
  local_3c[4] = 1;
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_3d.c = '(';
  utility::operator>>(in,&local_3d);
  lVar2 = 0;
  do {
    std::wistream::operator>>((wistream *)in,(int *)((long)local_3c + lVar2));
    if (lVar2 == 0x10) break;
    local_3d.c = ' ';
    utility::operator>>(in,&local_3d);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x14);
  local_3d.c = ')';
  utility::operator>>(in,&local_3d);
  lVar2 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar2 + 0x20] & 5) == 0) {
    S->r[4] = local_3c[4];
    *(ulong *)S->r = CONCAT44(local_3c[1],local_3c[0]);
    *(ulong *)(S->r + 2) = CONCAT44(local_3c[3],local_3c[2]);
    lVar2 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar2 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, mrg_status &S) {
      mrg_status S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::delim('(');
      for (int i{0}; i < n; ++i) {
        in >> S_new.r[i];
        if (i + 1 < n)
          in >> utility::delim(' ');
      }
      in >> utility::delim(')');
      if (in)
        S = S_new;
      in.flags(flags);
      return in;
    }